

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_ManCreateLiterals(Fx_Man_t *p,int nVars)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *p_00;
  int i;
  int iVar5;
  
  p->nVars = 0;
  p->nLits = 0;
  iVar1 = 0;
  iVar5 = 0;
  while( true ) {
    if (p->vCubes->nSize <= iVar5) {
      if (iVar1 < nVars) {
        p->nVars = nVars;
        pVVar3 = Vec_IntStart(nVars * 2);
        p->vCounts = pVVar3;
        for (iVar1 = 0; iVar1 < p->vCubes->nSize; iVar1 = iVar1 + 1) {
          pVVar3 = Vec_WecEntry(p->vCubes,iVar1);
          for (iVar5 = 1; iVar5 < pVVar3->nSize; iVar5 = iVar5 + 1) {
            iVar2 = Vec_IntEntry(pVVar3,iVar5);
            Vec_IntAddToEntry(p->vCounts,iVar2,1);
          }
        }
        iVar1 = p->nVars * 2;
        pVVar4 = Vec_WecAlloc(iVar1);
        pVVar4->nSize = iVar1;
        p->vLits = pVVar4;
        for (iVar1 = 0; iVar1 < p->vCounts->nSize; iVar1 = iVar1 + 1) {
          iVar5 = Vec_IntEntry(p->vCounts,iVar1);
          pVVar3 = Vec_WecEntry(p->vLits,iVar1);
          Vec_IntGrow(pVVar3,iVar5);
        }
        for (iVar1 = 0; iVar1 < p->vCubes->nSize; iVar1 = iVar1 + 1) {
          pVVar3 = Vec_WecEntry(p->vCubes,iVar1);
          for (iVar5 = 1; iVar5 < pVVar3->nSize; iVar5 = iVar5 + 1) {
            iVar2 = Vec_IntEntry(pVVar3,iVar5);
            Vec_WecPush(p->vLits,iVar2,iVar1);
          }
        }
        pVVar3 = Vec_IntStartFull(p->nVars);
        p->vVarCube = pVVar3;
        for (iVar1 = 0; iVar1 < p->vCubes->nSize; iVar1 = iVar1 + 1) {
          p_00 = Vec_WecEntry(p->vCubes,iVar1);
          pVVar3 = p->vVarCube;
          iVar5 = Vec_IntEntry(p_00,0);
          iVar5 = Vec_IntEntry(pVVar3,iVar5);
          if (iVar5 == -1) {
            pVVar3 = p->vVarCube;
            iVar5 = Vec_IntEntry(p_00,0);
            Vec_IntWriteEntry(pVVar3,iVar5,iVar1);
          }
        }
        return;
      }
      __assert_fail("p->nVars < nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                    ,0x2fa,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
    }
    pVVar3 = Vec_WecEntry(p->vCubes,iVar5);
    if (pVVar3->nSize < 1) break;
    iVar2 = p->nVars;
    iVar1 = Vec_IntEntry(pVVar3,0);
    if (iVar1 < iVar2) {
      iVar1 = iVar2;
    }
    p->nVars = iVar1;
    iVar2 = pVVar3->nSize;
    p->nLits = p->nLits + iVar2 + -1;
    i = 1;
    while( true ) {
      if (iVar2 <= i) break;
      iVar1 = Vec_IntEntry(pVVar3,i);
      iVar2 = p->nVars;
      iVar1 = Abc_Lit2Var(iVar1);
      if (iVar1 < iVar2) {
        iVar1 = iVar2;
      }
      p->nVars = iVar1;
      i = i + 1;
      iVar2 = pVVar3->nSize;
    }
    iVar5 = iVar5 + 1;
  }
  __assert_fail("Vec_IntSize(vCube) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                ,0x2f3,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
}

Assistant:

void Fx_ManCreateLiterals( Fx_Man_t * p, int nVars )
{
    Vec_Int_t * vCube;
    int i, k, Lit, Count;
    // find the number of variables
    p->nVars = p->nLits = 0;
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        p->nVars = Abc_MaxInt( p->nVars, Vec_IntEntry(vCube, 0) );
        p->nLits += Vec_IntSize(vCube) - 1;
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            p->nVars = Abc_MaxInt( p->nVars, Abc_Lit2Var(Lit) );
    }
//    p->nVars++;
    assert( p->nVars < nVars );
    p->nVars = nVars;
    // count literals
    p->vCounts = Vec_IntStart( 2*p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_IntAddToEntry( p->vCounts, Lit, 1 );
    // start literals
    p->vLits = Vec_WecStart( 2*p->nVars );
    Vec_IntForEachEntry( p->vCounts, Count, Lit )
        Vec_IntGrow( Vec_WecEntry(p->vLits, Lit), Count );
    // fill out literals
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_WecPush( p->vLits, Lit, i );
    // create mapping of variable into the first cube
    p->vVarCube = Vec_IntStartFull( p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        if ( Vec_IntEntry(p->vVarCube, Vec_IntEntry(vCube, 0)) == -1 )
            Vec_IntWriteEntry( p->vVarCube, Vec_IntEntry(vCube, 0), i );
}